

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_node_connect(lysc_ctx *ctx,lysc_node *parent,lysc_node *node)

{
  ushort uVar1;
  lysc_module *plVar2;
  lysc_node_notif *plVar3;
  lys_module *plVar4;
  lys_module *plVar5;
  lys_module *plVar6;
  bool bVar7;
  lysc_ctx *plVar8;
  int iVar9;
  LY_ERR LVar10;
  lysc_node **pplVar11;
  lysc_node_action **pplVar12;
  lysc_node_notif *plVar13;
  char *name;
  lysc_node *plVar14;
  lysc_node **list;
  lysc_node_action **local_40;
  lysc_ctx *local_38;
  
  node->parent = parent;
  if (parent == (lysc_node *)0x0) {
    local_40 = (lysc_node_action **)0x0;
    if (ctx->ext == (lysc_ext_instance *)0x0) {
      plVar2 = ctx->cur_mod->compiled;
      if (node->nodetype == 0x400) {
        local_40 = (lysc_node_action **)&plVar2->notifs;
      }
      else if (node->nodetype == 0x100) {
        local_40 = &plVar2->rpcs;
      }
      else {
        local_40 = (lysc_node_action **)&plVar2->data;
      }
    }
    else {
      lyplg_ext_get_storage_p(ctx->ext,0x7760,&local_40);
    }
    pplVar12 = local_40;
    if (*local_40 != (lysc_node_action *)0x0) {
      (((*local_40)->field_0).node.prev)->next = node;
      node->prev = ((*local_40)->field_0).node.prev;
      pplVar12 = (lysc_node_action **)&((*local_40)->field_0).node.prev;
    }
    *pplVar12 = (lysc_node_action *)node;
    name = node->name;
    parent = (lysc_node *)0x0;
    goto LAB_00149f43;
  }
  uVar1 = node->nodetype;
  if (uVar1 < 0x1000) {
    if (uVar1 == 0x200) {
      pplVar11 = (lysc_node **)lysc_node_actions_p(parent);
    }
    else {
      if (uVar1 != 0x400) goto LAB_00149d95;
      pplVar11 = (lysc_node **)lysc_node_notifs_p(parent);
    }
  }
  else {
    if (uVar1 == 0x2000) {
      node->next = (lysc_node *)0x0;
      plVar14 = (lysc_node *)&parent[1].module;
LAB_00149e46:
      node->prev = plVar14;
      return LY_SUCCESS;
    }
    if (uVar1 == 0x1000) {
      if ((parent->nodetype & 0x300) == 0) {
        __assert_fail("parent->nodetype & (LYS_ACTION | LYS_RPC)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x9bb,
                      "LY_ERR lys_compile_node_connect(struct lysc_ctx *, struct lysc_node *, struct lysc_node *)"
                     );
      }
      plVar14 = (lysc_node *)&parent[2].next;
      node->next = plVar14;
      goto LAB_00149e46;
    }
LAB_00149d95:
    pplVar11 = lysc_node_child_p(parent);
  }
  if (pplVar11 == (lysc_node **)0x0) {
    __assert_fail("children",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x9cc,
                  "LY_ERR lys_compile_node_connect(struct lysc_ctx *, struct lysc_node *, struct lysc_node *)"
                 );
  }
  plVar13 = (lysc_node_notif *)*pplVar11;
  if (plVar13 == (lysc_node_notif *)0x0) {
    *pplVar11 = node;
    bVar7 = true;
    plVar13 = (lysc_node_notif *)0x0;
  }
  else if ((node->flags & 0x100) == 0) {
    plVar3 = (lysc_node_notif *)(plVar13->field_0).node.prev;
    plVar4 = node->module;
    if ((plVar3->field_0).node.module == plVar4) {
LAB_00149e7e:
      plVar13 = plVar3;
      bVar7 = false;
    }
    else {
      plVar5 = parent->module;
      plVar8 = ctx;
      if (plVar5 == plVar4) {
        bVar7 = true;
        if ((plVar13->field_0).node.module == plVar4) {
          do {
            plVar13 = (lysc_node_notif *)(plVar13->field_0).node.next;
          } while ((plVar13->field_0).node.module == plVar4);
          goto LAB_00149e66;
        }
      }
      else {
        do {
          local_38 = plVar8;
          plVar13 = (lysc_node_notif *)(plVar13->field_0).node.prev;
          plVar6 = (plVar13->field_0).node.module;
          if (plVar6 == plVar4) {
            bVar7 = false;
            ctx = local_38;
            goto LAB_00149ee5;
          }
          iVar9 = strcmp(plVar6->name,plVar4->name);
          bVar7 = false;
          ctx = local_38;
          if ((plVar6 == plVar5) || (iVar9 < 0)) goto LAB_00149ee5;
          plVar8 = local_38;
        } while (((plVar13->field_0).node.prev)->next != (lysc_node *)0x0);
        bVar7 = true;
      }
    }
  }
  else {
    if (node->module != parent->module) {
      __assert_fail("node->module == parent->module",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                    ,0x9d3,
                    "LY_ERR lys_compile_node_connect(struct lysc_ctx *, struct lysc_node *, struct lysc_node *)"
                   );
    }
    if ((undefined1  [80])((undefined1  [80])plVar13->field_0 & (undefined1  [80])0x1000000) !=
        (undefined1  [80])0x0) {
      do {
        plVar3 = plVar13;
        if ((undefined1  [80])((undefined1  [80])plVar13->field_0 & (undefined1  [80])0x1000000) ==
            (undefined1  [80])0x0) break;
        plVar13 = (lysc_node_notif *)(plVar13->field_0).node.next;
      } while (plVar13 != (lysc_node_notif *)0x0);
      goto LAB_00149e7e;
    }
LAB_00149e66:
    bVar7 = true;
  }
LAB_00149ee5:
  if (plVar13 != (lysc_node_notif *)0x0) {
    if (bVar7) {
      node->next = (lysc_node *)plVar13;
      node->prev = (plVar13->field_0).node.prev;
      (plVar13->field_0).node.prev = node;
      if (plVar13 != (lysc_node_notif *)*pplVar11) {
        pplVar11 = &node->prev->next;
      }
    }
    else {
      node->next = (plVar13->field_0).node.next;
      node->prev = (lysc_node *)plVar13;
      (plVar13->field_0).node.next = node;
      if (node->next == (lysc_node *)0x0) {
        pplVar11 = &(((lysc_node_notif *)*pplVar11)->field_0).node.prev;
      }
      else {
        pplVar11 = &node->next->prev;
      }
    }
    *pplVar11 = node;
  }
  name = node->name;
LAB_00149f43:
  LVar10 = lys_compile_node_uniqness(ctx,parent,name,node);
  if (LVar10 == LY_SUCCESS) {
    return LY_SUCCESS;
  }
  return LY_EEXIST;
}

Assistant:

LY_ERR
lys_compile_node_connect(struct lysc_ctx *ctx, struct lysc_node *parent, struct lysc_node *node)
{
    struct lysc_node **children, *anchor = NULL;
    int insert_after = 0;

    node->parent = parent;

    if (parent) {
        if (node->nodetype == LYS_INPUT) {
            assert(parent->nodetype & (LYS_ACTION | LYS_RPC));
            /* input node is part of the action but link it with output */
            node->next = &((struct lysc_node_action *)parent)->output.node;
            node->prev = node->next;
            return LY_SUCCESS;
        } else if (node->nodetype == LYS_OUTPUT) {
            /* output node is part of the action but link it with input */
            node->next = NULL;
            node->prev = &((struct lysc_node_action *)parent)->input.node;
            return LY_SUCCESS;
        } else if (node->nodetype == LYS_ACTION) {
            children = (struct lysc_node **)lysc_node_actions_p(parent);
        } else if (node->nodetype == LYS_NOTIF) {
            children = (struct lysc_node **)lysc_node_notifs_p(parent);
        } else {
            children = lysc_node_child_p(parent);
        }
        assert(children);

        if (!(*children)) {
            /* first child */
            *children = node;
        } else if (node->flags & LYS_KEY) {
            /* special handling of adding keys */
            assert(node->module == parent->module);
            anchor = *children;
            if (anchor->flags & LYS_KEY) {
                while ((anchor->flags & LYS_KEY) && anchor->next) {
                    anchor = anchor->next;
                }
                /* insert after the last key */
                insert_after = 1;
            } /* else insert before anchor (at the beginning) */
        } else if ((*children)->prev->module == node->module) {
            /* last child is from the same module, keep the order and insert at the end */
            anchor = (*children)->prev;
            insert_after = 1;
        } else if (parent->module == node->module) {
            /* adding module child after some augments were connected */
            for (anchor = *children; anchor->module == node->module; anchor = anchor->next) {}
        } else {
            /* some augments are already connected and we are connecting new ones,
             * keep module name order and insert the node into the children list */
            anchor = *children;
            do {
                anchor = anchor->prev;

                /* check that we have not found the last augment node from our module or
                 * the first augment node from a "smaller" module or
                 * the first node from a local module */
                if ((anchor->module == node->module) || (strcmp(anchor->module->name, node->module->name) < 0) ||
                        (anchor->module == parent->module)) {
                    /* insert after */
                    insert_after = 1;
                    break;
                }

                /* we have traversed all the nodes, insert before anchor (as the first node) */
            } while (anchor->prev->next);
        }

        /* insert */
        if (anchor) {
            if (insert_after) {
                node->next = anchor->next;
                node->prev = anchor;
                anchor->next = node;
                if (node->next) {
                    /* middle node */
                    node->next->prev = node;
                } else {
                    /* last node */
                    (*children)->prev = node;
                }
            } else {
                node->next = anchor;
                node->prev = anchor->prev;
                anchor->prev = node;
                if (anchor == *children) {
                    /* first node */
                    *children = node;
                } else {
                    /* middle node */
                    node->prev->next = node;
                }
            }
        }

        /* check the name uniqueness (even for an only child, it may be in case) */
        if (lys_compile_node_uniqness(ctx, parent, node->name, node)) {
            return LY_EEXIST;
        }
    } else {
        /* top-level element */
        struct lysc_node **list = NULL;

        if (ctx->ext) {
            lyplg_ext_get_storage_p(ctx->ext, LY_STMT_DATA_NODE_MASK, (void ***)&list);
        } else if (node->nodetype == LYS_RPC) {
            list = (struct lysc_node **)&ctx->cur_mod->compiled->rpcs;
        } else if (node->nodetype == LYS_NOTIF) {
            list = (struct lysc_node **)&ctx->cur_mod->compiled->notifs;
        } else {
            list = &ctx->cur_mod->compiled->data;
        }
        if (!(*list)) {
            *list = node;
        } else {
            /* insert at the end of the module's top-level nodes list */
            (*list)->prev->next = node;
            node->prev = (*list)->prev;
            (*list)->prev = node;
        }

        /* check the name uniqueness on top-level */
        if (lys_compile_node_uniqness(ctx, NULL, node->name, node)) {
            return LY_EEXIST;
        }
    }

    return LY_SUCCESS;
}